

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  long lVar1;
  long lVar2;
  real *prVar3;
  real *prVar4;
  real *prVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  
  lVar1 = A->m_;
  if (lVar1 != this->m_) {
    __assert_fail("A.m_ == m_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x43,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
  }
  lVar2 = A->n_;
  if (lVar2 == vec->m_) {
    if (0 < lVar1) {
      prVar3 = this->data_;
      prVar5 = A->data_;
      prVar4 = vec->data_;
      lVar6 = 0;
      do {
        prVar3[lVar6] = 0.0;
        if (0 < lVar2) {
          auVar8 = ZEXT816(0) << 0x40;
          lVar7 = 0;
          do {
            auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)prVar5[lVar7]),
                                     ZEXT416((uint)prVar4[lVar7]));
            prVar3[lVar6] = auVar8._0_4_;
            lVar7 = lVar7 + 1;
          } while (lVar2 != lVar7);
        }
        lVar6 = lVar6 + 1;
        prVar5 = prVar5 + lVar2;
      } while (lVar6 != lVar1);
    }
    return;
  }
  __assert_fail("A.n_ == vec.m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,0x44,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.m_ == m_);
  assert(A.n_ == vec.m_);
  for (int64_t i = 0; i < m_; i++) {
    data_[i] = 0.0;
    for (int64_t j = 0; j < A.n_; j++) {
      data_[i] += A.data_[i * A.n_ + j] * vec.data_[j];
    }
  }
}